

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

optional<char> __thiscall Tokenizer::next(Tokenizer *this)

{
  int iVar1;
  int unaff_EBP;
  ushort uVar2;
  
  iVar1 = this->pos;
  if ((ulong)(long)iVar1 < (this->program)._M_string_length) {
    this->col_number = this->col_number + 1;
    this->pos = iVar1 + 1;
    unaff_EBP = (int)(this->program)._M_dataplus._M_p[iVar1];
    std::__cxx11::string::push_back((char)&this->current_line);
    uVar2 = 0x100;
    if (unaff_EBP == 10) {
      this->col_number = 0;
      this->line_number = this->line_number + 1;
      std::__cxx11::string::_M_replace
                ((ulong)&this->current_line,0,(char *)(this->current_line)._M_string_length,0x119626
                );
      unaff_EBP = 10;
    }
  }
  else {
    uVar2 = 0;
  }
  return (_Optional_base<char,_true,_true>)(uVar2 | (ushort)unaff_EBP & 0xff);
}

Assistant:

optional<char> Tokenizer::next() {
    if (pos >= program.size())
        return {};
    col_number++;
    char c = program[pos++];
    current_line += c;

    if (c == '\n') {
        col_number = 0;
        line_number++;
        current_line = "";
    }
    return c;
}